

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLevel3DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec3 *coord,UVec4 *result)

{
  ulong uVar1;
  long lVar2;
  int c;
  int c_00;
  Sampler *pSVar3;
  int y;
  int z;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar12 [16];
  Vector<bool,_4> res;
  Vector<unsigned_int,_4> color;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_88;
  undefined4 local_6c;
  Sampler *local_68;
  UVec4 *local_60;
  undefined1 local_58 [16];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_60 = result;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  local_68 = sampler;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,(access->m_size).m_data[2],
             coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
  fVar6 = floorf(local_38);
  fVar7 = floorf(local_34);
  fVar8 = floorf(local_40);
  fVar9 = floorf(local_3c);
  fVar10 = floorf(local_48);
  local_88 = (int)fVar10;
  fVar10 = floorf(local_44);
  pSVar3 = local_68;
  if (local_88 <= (int)fVar10) {
    c = (int)fVar8;
    do {
      for (; c_00 = (int)fVar6, c <= (int)fVar9; c = c + 1) {
        for (; c_00 <= (int)fVar7; c_00 = c_00 + 1) {
          y = TexVerifierUtil::wrap(pSVar3->wrapS,c_00,(access->m_size).m_data[0]);
          z = TexVerifierUtil::wrap(pSVar3->wrapT,c,(access->m_size).m_data[1]);
          iVar4 = TexVerifierUtil::wrap(pSVar3->wrapR,local_88,(access->m_size).m_data[2]);
          if ((((y < 0) || ((access->m_size).m_data[0] <= y)) || (z < 0)) ||
             ((((access->m_size).m_data[1] <= z || (iVar4 < 0)) ||
              ((access->m_size).m_data[2] <= iVar4)))) {
            sampleTextureBorder<unsigned_int>((TextureFormat *)local_58,(Sampler *)access);
          }
          else {
            ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_58,(int)access,y,z);
          }
          uVar11 = -(uint)((int)(local_60->m_data[0] ^ 0x80000000) <
                          (int)(local_58._0_4_ ^ 0x80000000));
          uVar13 = -(uint)((int)(local_60->m_data[1] ^ 0x80000000) <
                          (int)(local_58._4_4_ ^ 0x80000000));
          uVar14 = -(uint)((int)(local_60->m_data[2] ^ 0x80000000) <
                          (int)(local_58._8_4_ ^ 0x80000000));
          uVar15 = -(uint)((int)(local_60->m_data[3] ^ 0x80000000) <
                          (int)(local_58._12_4_ ^ 0x80000000));
          auVar12._0_4_ =
               -(uint)((int)((prec->colorThreshold).m_data[0] ^ 0x80000000) <
                      (int)(uVar11 - (local_58._0_4_ - local_60->m_data[0] ^ uVar11) ^ 0x80000000));
          auVar12._4_4_ =
               -(uint)((int)((prec->colorThreshold).m_data[1] ^ 0x80000000) <
                      (int)(uVar13 - (local_58._4_4_ - local_60->m_data[1] ^ uVar13) ^ 0x80000000));
          auVar12._8_4_ =
               -(uint)((int)((prec->colorThreshold).m_data[2] ^ 0x80000000) <
                      (int)(uVar14 - (local_58._8_4_ - local_60->m_data[2] ^ uVar14) ^ 0x80000000));
          auVar12._12_4_ =
               -(uint)((int)((prec->colorThreshold).m_data[3] ^ 0x80000000) <
                      (int)(uVar15 - (local_58._12_4_ - local_60->m_data[3] ^ uVar15) ^ 0x80000000))
          ;
          auVar12 = packssdw(auVar12,auVar12);
          auVar12 = packsswb(auVar12 ^ _DAT_00ab3420,auVar12 ^ _DAT_00ab3420);
          local_6c = *(uint *)(prec->colorMask).m_data ^ 0x1010101 | auVar12._0_4_ & 0x1010101;
          if ((char)local_6c != '\0') {
            uVar5 = 0xffffffffffffffff;
            do {
              if (uVar5 == 2) {
                return true;
              }
              uVar1 = uVar5 + 1;
              lVar2 = uVar5 + 2;
              uVar5 = uVar1;
            } while (*(char *)((long)&local_6c + lVar2) != '\0');
            if (2 < uVar1) {
              return true;
            }
          }
        }
      }
      local_88 = local_88 + 1;
      c = (int)fVar8;
    } while (local_88 <= (int)fVar10);
  }
  return false;
}

Assistant:

bool isLevel3DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 const UVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, result);
}